

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

int cJSON_strcasecmp(char *s1,char *s2)

{
  byte bVar1;
  __int32_t *p_Var2;
  uint uVar3;
  __int32_t **pp_Var4;
  long lVar5;
  
  if (s1 == (char *)0x0) {
    uVar3 = (uint)(s2 != (char *)0x0);
  }
  else if (s2 == (char *)0x0) {
    uVar3 = 1;
  }
  else {
    pp_Var4 = __ctype_tolower_loc();
    p_Var2 = *pp_Var4;
    lVar5 = 0;
    while( true ) {
      bVar1 = s1[lVar5];
      if (p_Var2[(char)bVar1] != p_Var2[s2[lVar5]]) break;
      if ((ulong)bVar1 == 0) {
        return 0;
      }
      lVar5 = lVar5 + 1;
    }
    uVar3 = p_Var2[bVar1] - p_Var2[(byte)s2[lVar5]];
  }
  return uVar3;
}

Assistant:

static int cJSON_strcasecmp(const char *s1,const char *s2)
{
	if (!s1) return (s1==s2)?0:1;if (!s2) return 1;
	for(; tolower(*s1) == tolower(*s2); ++s1, ++s2)	if(*s1 == 0)	return 0;
	return tolower(*(const unsigned char *)s1) - tolower(*(const unsigned char *)s2);
}